

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiout.cpp
# Opt level: O0

int RtMidiOut_register(lua_State *L)

{
  int iVar1;
  lua_State *L_local;
  
  lua_pushlightuserdata(L,&(anonymous_namespace)::REGISTRY_CHANNELOUT);
  lua_rawget(L,0xfff0b9d8);
  iVar1 = lua_type(L,0xffffffff);
  if (iVar1 != 5) {
    lua_settop(L,0xfffffffe);
    lua_createtable(L,0);
    lua_createtable(L,0,1);
    lua_pushlstring(L,"__mode",6);
    lua_pushlstring(L,"k",1);
    lua_rawset(L,0xfffffffd);
    lua_setmetatable(L,0xfffffffe);
    lua_pushlightuserdata(L,&(anonymous_namespace)::REGISTRY_CHANNELOUT);
    lua_pushvalue(L,0xfffffffe);
    lua_rawset(L,0xfff0b9d8);
  }
  lua_settop(L,0xfffffffe);
  iVar1 = luaL_newmetatable(L,"luartmidi.rtmidiout");
  if (iVar1 != 0) {
    lua_pushlstring(L,"__index",7);
    luaNewLib<6ul>(L,(luaL_Reg (*) [6])(anonymous_namespace)::RtMidiOut_mt_index);
    lua_getfield(L,0xfff0b9d8,"luartmidi.rtmidi");
    lua_setmetatable(L,0xfffffffe);
    lua_rawset(L,0xfffffffd);
    lua_pushlstring(L,"__gc",4);
    lua_pushcclosure(L,anon_unknown.dwarf_16e00::RtMidiOut_dtor,0);
    lua_rawset(L,0xfffffffd);
  }
  lua_settop(L,0xfffffffe);
  lua_createtable(L,0);
  iVar1 = luaL_newmetatable(L,"luartmidi.rtmidiout.__class");
  if (iVar1 != 0) {
    lua_pushlstring(L,"__call",6);
    lua_pushcclosure(L,anon_unknown.dwarf_16e00::RtMidiOut_ctor,0);
    lua_rawset(L,0xfffffffd);
  }
  lua_setmetatable(L,0xfffffffe);
  return 1;
}

Assistant:

LUA_RTMIDI_LOCAL int RtMidiOut_register(lua_State *L) {
	// reference counting for channel objects:
	// each weakly counted ChannelOut object stores a strong ref to RtMidiOut
	lua_pushlightuserdata(L, &REGISTRY_CHANNELOUT);
	lua_rawget(L, LUA_REGISTRYINDEX);
	if (!lua_istable(L, -1)) {
		lua_pop(L, 1);
		lua_newtable(L);
		lua_createtable(L, 0, 1);
		lua_pushliteral(L, "__mode");
		lua_pushliteral(L, "k");
		lua_rawset(L, -3);
		lua_setmetatable(L, -2);
		lua_pushlightuserdata(L, &REGISTRY_CHANNELOUT);
		lua_pushvalue(L, -2);
		lua_rawset(L, LUA_REGISTRYINDEX);
	}
	lua_pop(L, 1);

	// instance methods
	if (luaL_newmetatable(L, MT_RTMIDIOUT)) {
		lua_pushliteral(L, "__index");
		luaNewLib(L, RtMidiOut_mt_index);
		luaL_getmetatable(L, MT_RTMIDI);
		lua_setmetatable(L, -2);
		lua_rawset(L, -3);

		lua_pushliteral(L, "__gc");
		lua_pushcfunction(L, RtMidiOut_dtor);
		lua_rawset(L, -3);
	}
	lua_pop(L, 1);

	// constructor
	lua_newtable(L);
	if (luaL_newmetatable(L, MT_RTMIDIOUT_CLASS)) {
		lua_pushliteral(L, "__call");
		lua_pushcfunction(L, RtMidiOut_ctor);
		lua_rawset(L, -3);
	}
	lua_setmetatable(L, -2);

	return 1;
}